

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O2

int VP8LBuildHuffmanTable
              (HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size)

{
  int iVar1;
  uint16_t *sorted_00;
  uint16_t sorted [512];
  
  if (root_table != (HuffmanCode *)0x0) {
    if (code_lengths_size < 0x201) {
      iVar1 = BuildHuffmanTable(root_table,root_bits,code_lengths,code_lengths_size,sorted);
    }
    else {
      sorted_00 = (uint16_t *)WebPSafeMalloc((ulong)(uint)code_lengths_size,2);
      if (sorted_00 == (uint16_t *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = BuildHuffmanTable(root_table,root_bits,code_lengths,code_lengths_size,sorted_00);
        WebPSafeFree(sorted_00);
      }
    }
    return iVar1;
  }
  iVar1 = BuildHuffmanTable((HuffmanCode *)0x0,root_bits,code_lengths,code_lengths_size,
                            (uint16_t *)0x0);
  return iVar1;
}

Assistant:

int VP8LBuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                          const int code_lengths[], int code_lengths_size) {
  int total_size;
  assert(code_lengths_size <= MAX_CODE_LENGTHS_SIZE);
  if (root_table == NULL) {
    total_size = BuildHuffmanTable(NULL, root_bits,
                                   code_lengths, code_lengths_size, NULL);
  } else if (code_lengths_size <= SORTED_SIZE_CUTOFF) {
    // use local stack-allocated array.
    uint16_t sorted[SORTED_SIZE_CUTOFF];
    total_size = BuildHuffmanTable(root_table, root_bits,
                                   code_lengths, code_lengths_size, sorted);
  } else {   // rare case. Use heap allocation.
    uint16_t* const sorted =
        (uint16_t*)WebPSafeMalloc(code_lengths_size, sizeof(*sorted));
    if (sorted == NULL) return 0;
    total_size = BuildHuffmanTable(root_table, root_bits,
                                   code_lengths, code_lengths_size, sorted);
    WebPSafeFree(sorted);
  }
  return total_size;
}